

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_efb276::RegexMatch
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  bool bVar1;
  const_reference s;
  cmMakefile *pcVar2;
  size_type sVar3;
  string local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string e_1;
  size_type r;
  size_type l;
  string output;
  string local_328 [32];
  string_view local_308;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2f8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2e8;
  undefined1 local_2d8 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [8];
  string e;
  undefined1 local_260 [8];
  RegularExpression re;
  string *outvar;
  string *regex;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,2);
  re._552_8_ = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,3);
  pcVar2 = cmExecutionStatus::GetMakefile(status);
  cmMakefile::ClearMatches(pcVar2);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_260);
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_260,s);
  if (!bVar1) {
    std::operator+(&local_2b0,"sub-command REGEX, mode MATCH failed to compile regex \"",s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   &local_2b0,"\".");
    std::__cxx11::string::~string((string *)&local_2b0);
    cmExecutionStatus::SetError(status,(string *)local_290);
    args_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_290);
    goto LAB_0074dd98;
  }
  local_2f8 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (args);
  local_2e8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_2f8,4);
  std::__cxx11::string::string(local_328);
  local_308 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_328);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&output.field_2 + 8));
  cmJoin((string *)local_2d8,&local_2e8,local_308,stack0xfffffffffffffcc8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::string((string *)&l);
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_260,(string *)local_2d8);
  if (bVar1) {
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    cmMakefile::StoreMatches(pcVar2,(RegularExpression *)local_260);
    sVar3 = cmsys::RegularExpression::start((RegularExpression *)local_260);
    e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)local_260);
    if (e_1.field_2._8_8_ != sVar3) {
      std::__cxx11::string::substr((ulong)local_3c8,(ulong)local_2d8);
      std::__cxx11::string::operator=((string *)&l,local_3c8);
      std::__cxx11::string::~string(local_3c8);
      goto LAB_0074dcfc;
    }
    std::operator+(&local_3a8,"sub-command REGEX, mode MATCH regex \"",s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                   &local_3a8,"\" matched an empty string.");
    std::__cxx11::string::~string((string *)&local_3a8);
    cmExecutionStatus::SetError(status,(string *)local_388);
    args_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_388);
  }
  else {
LAB_0074dcfc:
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    name = re._552_8_;
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&l);
    cmMakefile::AddDefinition(pcVar2,(string *)name,value);
    args_local._7_1_ = true;
    input.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)local_2d8);
LAB_0074dd98:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_260);
  return args_local._7_1_;
}

Assistant:

bool RegexMatch(std::vector<std::string> const& args,
                cmExecutionStatus& status)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  status.GetMakefile().ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex)) {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \"" + regex +
      "\".";
    status.SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if (re.find(input)) {
    status.GetMakefile().StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCH regex \"" + regex +
        "\" matched an empty string.";
      status.SetError(e);
      return false;
    }
    output = input.substr(l, r - l);
  }

  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}